

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void QTest::qCaught(char *expected,char *what,char *file,int line)

{
  long in_FS_OFFSET;
  anon_class_16_2_bfae958d message;
  QString *in_stack_ffffffffffffff78;
  char *message_00;
  char local_58 [48];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  anon_class_16_2_bfae958d *this;
  
  this = *(anon_class_16_2_bfae958d **)(in_FS_OFFSET + 0x28);
  local_28 = local_18;
  puStack_20 = local_10;
  message_00 = local_58;
  qCaught::anon_class_16_2_bfae958d::operator()(this);
  QString::toUtf8(in_stack_ffffffffffffff78);
  QByteArray::constData((QByteArray *)0x151d7e);
  qFail(message_00,(char *)in_stack_ffffffffffffff78,0);
  QByteArray::~QByteArray((QByteArray *)0x151d9b);
  QString::~QString((QString *)0x151da5);
  if (*(anon_class_16_2_bfae958d **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTest::qCaught(const char *expected, const char *what, const char *file, int line)
{
    auto message = [&] {
        const auto exType  = what ? "std::" : "unknown ";
        const auto ofType  = expected ? " of type " : "";
        const auto no      = expected ? "an" : "no";
        const auto withMsg = what ? " with message " : "";
        const auto protect = [](const char *s) { return s ? s : ""; };

        return QString::asprintf("Expected %s exception%s%s to be thrown, "
                                 "but caught %sexception%s%s",
                                 no, ofType, protect(expected),
                                 exType, withMsg, protect(what));
    };
    qFail(message().toUtf8().constData(), file, line);
}